

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBox::mouseReleaseEvent(QAbstractSpinBox *this,QMouseEvent *event)

{
  long lVar1;
  KeyboardModifiers KVar2;
  QAbstractSpinBoxPrivate *pQVar3;
  socklen_t *__addr_len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int in_ESI;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QAbstractSpinBoxPrivate *d;
  QAbstractSpinBoxPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAbstractSpinBoxPrivate *)CONCAT44(in_register_00000034,in_ESI);
  pQVar3 = d_func((QAbstractSpinBox *)0x68a1fa);
  KVar2 = QInputEvent::modifiers((QInputEvent *)this_00);
  __addr_len = (socklen_t *)
               (ulong)(uint)KVar2.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                            super_QFlagsStorage<Qt::KeyboardModifier>.i;
  (pQVar3->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (Int)KVar2.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
            super_QFlagsStorage<Qt::KeyboardModifier>.i;
  __addr = extraout_RDX;
  if ((pQVar3->buttonState & 2) != 0) {
    QAbstractSpinBoxPrivate::reset(this_00);
    __addr = extraout_RDX_00;
  }
  QEvent::accept((QEvent *)this_00,in_ESI,__addr,__addr_len);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QAbstractSpinBox);

    d->keyboardModifiers = event->modifiers();
    if ((d->buttonState & Mouse) != 0)
        d->reset();
    event->accept();
}